

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_integration_rule.unit.cpp
# Opt level: O0

void __thiscall
TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test::
TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test
          (TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test *this)

{
  TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test *this_local;
  
  TestCreateIntegrationRule::TestCreateIntegrationRule(&this->super_TestCreateIntegrationRule);
  (this->super_TestCreateIntegrationRule).super_Test._vptr_Test =
       (_func_int **)&PTR__TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test_00203f30;
  return;
}

Assistant:

TEST_F(TestCreateIntegrationRule, TestCreateIntegrationRule_Table) {
	SCOPED_TRACE("Begin Test: Create Table Integration Rule.");

	std::string line = "Pre-weighted Table";

	Integration_Rule rule = create_integration_rule(line);

	EXPECT_EQ(rule.type, Integration_Rule_Type::TABLE);

	line = "Pre-weighted Table (Normalized, k=1.0)";
	rule = create_integration_rule(line);

	EXPECT_EQ(rule.type, Integration_Rule_Type::TABLE);
	EXPECT_EQ(rule.k, 1.0);
}